

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

void __thiscall QRhiGles2::releaseCachedResources(QRhiGles2 *this)

{
  QHash<QRhiShaderStage,_unsigned_int> *this_00;
  ulong uVar1;
  bool bVar2;
  Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *pDVar3;
  ulong uVar4;
  Data *pDVar5;
  
  bVar2 = ensureContext(this,(QSurface *)0x0);
  if (!bVar2) {
    return;
  }
  this_00 = &this->m_shaderCache;
  pDVar3 = (this->m_shaderCache).d;
  if (pDVar3 == (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0) {
    pDVar5 = (Data *)0x0;
  }
  else {
    if (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar3 = QHashPrivate::Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_>::detached
                         (pDVar3);
      this_00->d = pDVar3;
    }
    pDVar5 = this_00->d;
    if (pDVar5->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        if (pDVar5->numBuckets == uVar4) {
          pDVar5 = (Data *)0x0;
          uVar4 = 0;
          break;
        }
        uVar1 = uVar4 + 1;
      } while (pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
      goto LAB_00571457;
    }
  }
  uVar4 = 0;
LAB_00571457:
  if (pDVar5 != (Data *)0x0 || uVar4 != 0) {
    do {
      (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
        [0x45])((ulong)*(uint *)(pDVar5->spans[uVar4 >> 7].entries
                                 [pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f]].storage.
                                 data + 0x18));
      do {
        if (pDVar5->numBuckets - 1 == uVar4) {
          pDVar5 = (Data *)0x0;
          uVar4 = 0;
          break;
        }
        uVar4 = uVar4 + 1;
      } while (pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
    } while ((pDVar5 != (Data *)0x0) || (uVar4 != 0));
  }
  QHash<QRhiShaderStage,_unsigned_int>::clear(this_00);
  QHash<QByteArray,_QRhiGles2::PipelineCacheData>::clear(&this->m_pipelineCache);
  return;
}

Assistant:

void QRhiGles2::releaseCachedResources()
{
    if (!ensureContext())
        return;

    for (uint shader : m_shaderCache)
        f->glDeleteShader(shader);

    m_shaderCache.clear();

    m_pipelineCache.clear();
}